

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_0018e020;
  std::__cxx11::string::~string((string *)&this->groupInfo);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() = default;